

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_dirname(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  undefined8 in_RAX;
  char *pcVar1;
  int iDirlen;
  int iLen;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    pcVar1 = "";
    iDirlen = 0;
  }
  else {
    _iDirlen = in_RAX;
    pcVar1 = jx9_value_to_string(*apArg,&iLen);
    if (iLen < 1) {
      pcVar1 = ".";
      iDirlen = 1;
    }
    else {
      pcVar1 = jx9ExtractDirName(pcVar1,iLen,&iDirlen);
    }
  }
  jx9_result_string(pCtx,pcVar1,iDirlen);
  return 0;
}

Assistant:

static int jx9Builtin_dirname(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zPath, *zDir;
	int iLen, iDirlen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Point to the target path */
	zPath = jx9_value_to_string(apArg[0], &iLen);
	if( iLen < 1 ){
		/* Reuturn "." */
		jx9_result_string(pCtx, ".", sizeof(char));
		return JX9_OK;
	}
	/* Perform the requested operation */
	zDir = jx9ExtractDirName(zPath, iLen, &iDirlen);
	/* Return directory name */
	jx9_result_string(pCtx, zDir, iDirlen);
	return JX9_OK;
}